

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.hpp
# Opt level: O3

unique_ptr<pstore::sparse_array<int,_pstore::uint128>,_std::default_delete<pstore::sparse_array<int,_pstore::uint128>_>_>
 pstore::sparse_array<int,pstore::uint128>::
 make_unique<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
           (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
            first_index,
           __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
           last_index,initializer_list<int> values)

{
  uint128 *puVar1;
  sparse_array<int,pstore::uint128> *this;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  last;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  first;
  undefined8 extraout_RDX;
  long in_R8;
  
  last._M_current = (unsigned_long *)values._M_len;
  first._M_current = (unsigned_long *)values._M_array;
  puVar1 = bitmap<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,void>
                     ((uint128 *)last_index._M_current,
                      (sparse_array<int,pstore::uint128> *)first._M_current,
                      (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                       )first._M_current,last);
  this = (sparse_array<int,pstore::uint128> *)
         operator_new((ulong)(((int)POPCOUNT(extraout_RDX) + (int)POPCOUNT(puVar1) +
                              (uint)((int)POPCOUNT(extraout_RDX) + (int)POPCOUNT(puVar1) == 0)) * 4
                             + 0x1c));
  sparse_array<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,int_const*>
            (this,last_index,first,(int *)last._M_current,(int *)((long)last._M_current + in_R8 * 4)
            );
  *first_index._M_current = (unsigned_long)this;
  return (__uniq_ptr_data<pstore::sparse_array<int,_pstore::uint128>,_std::default_delete<pstore::sparse_array<int,_pstore::uint128>_>,_true,_true>
          )(__uniq_ptr_data<pstore::sparse_array<int,_pstore::uint128>,_std::default_delete<pstore::sparse_array<int,_pstore::uint128>_>,_true,_true>
            )first_index._M_current;
}

Assistant:

auto sparse_array<ValueType, BitmapType>::make_unique (IteratorIdx first_index,
                                                           IteratorIdx last_index,
                                                           std::initializer_list<ValueType> values)
        -> std::unique_ptr<sparse_array> {

        return std::unique_ptr<sparse_array<ValueType, BitmapType>>{
            new (first_index, last_index) sparse_array<ValueType, BitmapType> (
                first_index, last_index, std::begin (values), std::end (values))};
    }